

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O1

int dsa_priv_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  int iVar2;
  DSA *r;
  BIGNUM *pBVar3;
  BN_CTX *ctx;
  
  r = (DSA *)DSA_parse_parameters(params);
  if ((r == (DSA *)0x0) || (params->len != 0)) {
    iVar2 = 0x57;
  }
  else {
    pBVar3 = BN_new();
    r->q = pBVar3;
    if (pBVar3 == (BIGNUM *)0x0) {
      iVar1 = 0;
      goto LAB_001a6b66;
    }
    iVar1 = BN_parse_asn1_unsigned(key,(BIGNUM *)pBVar3);
    if ((iVar1 == 0) || (key->len != 0)) {
      iVar2 = 0x60;
    }
    else {
      iVar1 = dsa_check_key((DSA *)r);
      if (iVar1 != 0) {
        ctx = BN_CTX_new();
        pBVar3 = BN_new();
        r->p = pBVar3;
        iVar1 = 0;
        if (pBVar3 != (BIGNUM *)0x0 && ctx != (BN_CTX *)0x0) {
          iVar1 = 0;
          iVar2 = BN_mod_exp_mont_consttime
                            (pBVar3,*(BIGNUM **)&r->write_params,r->q,*(BIGNUM **)r,ctx,
                             (BN_MONT_CTX *)0x0);
          if (iVar2 != 0) {
            evp_pkey_set_method(out,&dsa_asn1_meth);
            out->pkey = r;
            iVar1 = 1;
            r = (DSA *)0x0;
          }
        }
        if (ctx != (BN_CTX *)0x0) {
          BN_CTX_free(ctx);
        }
        goto LAB_001a6b66;
      }
      iVar2 = 0x68;
    }
  }
  iVar1 = 0;
  ERR_put_error(6,0,0x66,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                ,iVar2);
LAB_001a6b66:
  if (r != (DSA *)0x0) {
    DSA_free(r);
  }
  return iVar1;
}

Assistant:

static int dsa_priv_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See PKCS#11, v2.40, section 2.5.

  // Decode parameters.
  bssl::UniquePtr<DSA> dsa(DSA_parse_parameters(params));
  if (dsa == nullptr || CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  dsa->priv_key = BN_new();
  if (dsa->priv_key == nullptr) {
    return 0;
  }
  if (!BN_parse_asn1_unsigned(key, dsa->priv_key) || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  // To avoid DoS attacks when importing private keys, check bounds on |dsa|.
  // This bounds |dsa->priv_key| against |dsa->q| and bounds |dsa->q|'s bit
  // width.
  if (!dsa_check_key(dsa.get())) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  // Calculate the public key.
  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  dsa->pub_key = BN_new();
  if (ctx == nullptr || dsa->pub_key == nullptr ||
      !BN_mod_exp_mont_consttime(dsa->pub_key, dsa->g, dsa->priv_key, dsa->p,
                                 ctx.get(), nullptr)) {
    return 0;
  }

  EVP_PKEY_assign_DSA(out, dsa.release());
  return 1;
}